

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void Configtable_init(void)

{
  s_x4 *__ptr;
  s_x4node *psVar1;
  long lVar2;
  
  if (x4a != (s_x4 *)0x0) {
    return;
  }
  __ptr = (s_x4 *)malloc(0x18);
  x4a = __ptr;
  if (__ptr != (s_x4 *)0x0) {
    __ptr->size = 0x40;
    __ptr->count = 0;
    psVar1 = (s_x4node *)calloc(0x40,0x20);
    __ptr->tbl = psVar1;
    if (psVar1 == (s_x4node *)0x0) {
      free(__ptr);
      x4a = (s_x4 *)0x0;
    }
    else {
      __ptr->ht = (s_x4node **)(psVar1 + 0x40);
      for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 1) {
        __ptr->ht[lVar2] = (s_x4node *)0x0;
      }
    }
  }
  return;
}

Assistant:

void Configtable_init(){
  if( x4a ) return;
  x4a = (struct s_x4*)malloc( sizeof(struct s_x4) );
  if( x4a ){
    x4a->size = 64;
    x4a->count = 0;
    x4a->tbl = (x4node*)calloc(64, sizeof(x4node) + sizeof(x4node*));
    if( x4a->tbl==0 ){
      free(x4a);
      x4a = 0;
    }else{
      int i;
      x4a->ht = (x4node**)&(x4a->tbl[64]);
      for(i=0; i<64; i++) x4a->ht[i] = 0;
    }
  }
}